

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cmMakefile::DeferGetCallIds_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,cmMakefile *this)

{
  DeferCommands *pDVar1;
  pointer pDVar2;
  size_t sVar3;
  char *pcVar4;
  __normal_iterator<const_cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>
  _Var5;
  _Alloc_hider _Var6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  TransformIterator<RangeIterators::FilterIterator<__gnu_cxx::__normal_iterator<const_cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmMakefile_cxx:3048:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmMakefile_cxx:3050:11)>
  local_b8;
  pointer local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  string sep;
  TransformIterator<RangeIterators::FilterIterator<__gnu_cxx::__normal_iterator<const_cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmMakefile_cxx:3048:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmMakefile_cxx:3050:11)>
  local_58;
  
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  pDVar1 = (this->Defer)._M_t.
           super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
           .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl;
  if (pDVar1 == (DeferCommands *)0x0) {
    return __return_storage_ptr__;
  }
  local_b8.Base.Cur._M_current =
       *(DeferCommand **)
        &(pDVar1->Commands).
         super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>;
  pDVar2 = *(pointer *)
            ((long)&(pDVar1->Commands).
                    super__Vector_base<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
            + 8);
  local_b8.Base.End._M_current = pDVar2;
  RangeIterators::
  FilterIterator<__gnu_cxx::__normal_iterator<const_cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx:3048:17)>
  ::SatisfyPredicate(&local_b8.Base);
  sep._M_dataplus._M_p = (pointer)pDVar2;
  sep._M_string_length = (size_type)pDVar2;
  RangeIterators::
  FilterIterator<__gnu_cxx::__normal_iterator<const_cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx:3048:17)>
  ::SatisfyPredicate((FilterIterator<__gnu_cxx::__normal_iterator<const_cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmMakefile_cxx:3048:17)>
                      *)&sep);
  _Var6._M_p = sep._M_dataplus._M_p;
  _Var5._M_current = local_b8.Base.Cur._M_current;
  pcVar4 = cmList::element_separator._M_str;
  sVar3 = cmList::element_separator._M_len;
  local_98 = local_b8.Base.End._M_current;
  uStack_90 = local_b8.Base._16_8_;
  local_b8._24_8_ = local_88;
  lVar7 = 0;
  while (local_b8.Base.Cur._M_current != (DeferCommand *)_Var6._M_p) {
    RangeIterators::
    TransformIterator<RangeIterators::FilterIterator<__gnu_cxx::__normal_iterator<const_cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx:3048:17)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx:3050:11)>
    ::operator++((TransformIterator<RangeIterators::FilterIterator<__gnu_cxx::__normal_iterator<const_cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmMakefile_cxx:3048:17)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JeremieA[P]CMake_Source_cmMakefile_cxx:3050:11)>
                  *)&local_b8.Base);
    lVar7 = lVar7 + -1;
  }
  if (lVar7 != 0) {
    local_c8._M_len = sVar3;
    local_c8._M_str = pcVar4;
    if (_Var5._M_current != (DeferCommand *)_Var6._M_p) {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&sep,&local_c8,(allocator<char> *)&local_b8);
      std::__cxx11::string::string((string *)&local_e8,(string *)_Var5._M_current);
      local_b8.Base.End._M_current = local_98;
      local_b8.Base._16_8_ = uStack_90;
      local_b8._24_8_ = local_88;
      local_b8.Base.Cur._M_current = _Var5._M_current;
      for (lVar7 = -1; lVar7 != 0; lVar7 = lVar7 + 1) {
        RangeIterators::
        TransformIterator<RangeIterators::FilterIterator<__gnu_cxx::__normal_iterator<const_cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx:3048:17)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx:3050:11)>
        ::operator++(&local_b8);
      }
      local_58.Base._16_8_ = local_b8.Base._16_8_;
      local_58._24_8_ = local_b8._24_8_;
      local_58.Base.Cur._M_current = local_b8.Base.Cur._M_current;
      local_58.Base.End._M_current = local_b8.Base.End._M_current;
      while (local_58.Base.Cur._M_current != (DeferCommand *)_Var6._M_p) {
        std::__cxx11::string::append((string *)&local_e8);
        std::__cxx11::string::append((string *)&local_e8);
        RangeIterators::
        TransformIterator<RangeIterators::FilterIterator<__gnu_cxx::__normal_iterator<const_cmMakefile::DeferCommand_*,_std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx:3048:17)>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx:3050:11)>
        ::operator++(&local_58);
      }
      std::__cxx11::string::~string((string *)&sep);
      goto LAB_001c9ab6;
    }
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
LAB_001c9ab6:
  std::optional<std::__cxx11::string>::operator=
            ((optional<std::__cxx11::string> *)__return_storage_ptr__,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::string> cmMakefile::DeferGetCallIds() const
{
  cm::optional<std::string> ids;
  if (this->Defer) {
    ids = cmList::to_string(
      cmMakeRange(this->Defer->Commands)
        .filter([](DeferCommand const& dc) -> bool { return !dc.Id.empty(); })
        .transform(
          [](DeferCommand const& dc) -> std::string const& { return dc.Id; }));
  }
  return ids;
}